

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseRelationship(AsciiParser *this,Relationship *result)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long lVar5;
  char c;
  allocator local_491;
  AsciiParser *local_490;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> values;
  string err;
  Path base_prim_path;
  Path value;
  string local_298;
  Path abs_path;
  ostringstream ss_e;
  
  bVar1 = LookChar1(this,&c);
  if (bVar1) {
    if (c == '[') {
      values.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ParseBasicTypeArray<tinyusdz::Path>(this,&values);
      if (bVar1) {
        uVar3 = 0xffffffffffffffff;
        lVar5 = 0;
        local_490 = this;
        do {
          uVar3 = uVar3 + 1;
          if ((ulong)(((long)values.
                             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)values.
                            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0xd0) <= uVar3) {
            Relationship::set(result,&values);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&values);
            this = local_490;
            goto LAB_002c3d3b;
          }
          GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,local_490);
          ::std::__cxx11::string::string((string *)&base_prim_path,"",(allocator *)&abs_path);
          Path::Path(&value,(string *)&ss_e,&base_prim_path._prim_part);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          base_prim_path._prim_part._M_dataplus._M_p = (pointer)&base_prim_path._prim_part.field_2;
          base_prim_path._prim_part._M_string_length = 0;
          base_prim_path._prim_part.field_2._M_local_buf[0] = '\0';
          base_prim_path._prop_part._M_dataplus._M_p = (pointer)&base_prim_path._prop_part.field_2;
          base_prim_path._prop_part._M_string_length = 0;
          base_prim_path._prop_part.field_2._M_local_buf[0] = '\0';
          base_prim_path._variant_part._M_dataplus._M_p =
               (pointer)&base_prim_path._variant_part.field_2;
          base_prim_path._variant_part._M_string_length = 0;
          base_prim_path._variant_part.field_2._M_local_buf[0] = '\0';
          base_prim_path._variant_selection_part._M_dataplus._M_p =
               (pointer)&base_prim_path._variant_selection_part.field_2;
          base_prim_path._variant_selection_part._M_string_length = 0;
          base_prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
          base_prim_path._variant_part_str._M_dataplus._M_p =
               (pointer)&base_prim_path._variant_part_str.field_2;
          base_prim_path._variant_part_str._M_string_length = 0;
          base_prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
          base_prim_path._element._M_dataplus._M_p = (pointer)&base_prim_path._element.field_2;
          base_prim_path._element._M_string_length = 0;
          base_prim_path._element.field_2._M_local_buf[0] = '\0';
          base_prim_path._path_type.has_value_ = false;
          base_prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
          base_prim_path._valid = false;
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          bVar1 = pathutil::ResolveRelativePath
                            (&value,(Path *)((long)&((values.
                                                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _prim_part)._M_dataplus._M_p + lVar5),
                             &base_prim_path,(string *)0x0);
          if (bVar1) {
            Path::operator=((Path *)((long)&((values.
                                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->_prim_part
                                            )._M_dataplus._M_p + lVar5),&base_prim_path);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseRelationship");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdc9);
            ::std::operator<<(poVar2," ");
            ::std::__cxx11::string::string((string *)&err,"Invalid relative Path: {}.",&local_491);
            Path::full_path_name_abi_cxx11_
                      (&local_298,
                       (Path *)((long)&((values.
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_prim_part).
                                       _M_dataplus._M_p + lVar5));
            fmt::format<std::__cxx11::string>
                      ((string *)&abs_path,(fmt *)&err,(string *)&local_298,args);
            poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&abs_path);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            PushError(local_490,&abs_path._prim_part);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          }
          lVar5 = lVar5 + 0xd0;
          Path::~Path(&base_prim_path);
          Path::~Path(&value);
        } while (bVar1);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseRelationship");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdbe);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)&ss_e,"Failed to parse PathVector.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,&value._prim_part);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&values);
    }
    else if (c == 'N') {
      value._prim_part._M_dataplus._M_p = value._prim_part._M_dataplus._M_p & 0xffffffffffffff00;
      memset(&value._prim_part._M_string_length,0,0xd0);
      bVar1 = ReadBasicType(this,(optional<tinyusdz::Path> *)&value);
      if (bVar1) {
        if ((char)value._prim_part._M_dataplus._M_p != '\x01') {
          result->type = ValueBlock;
          nonstd::optional_lite::optional<tinyusdz::Path>::~optional
                    ((optional<tinyusdz::Path> *)&value);
LAB_002c3d3b:
          bVar1 = SkipWhitespaceAndNewline(this,true);
          return bVar1;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseRelationship");
        poVar2 = ::std::operator<<(poVar2,"():");
        iVar4 = 0xdda;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseRelationship");
        poVar2 = ::std::operator<<(poVar2,"():");
        iVar4 = 0xdd5;
      }
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,iVar4);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)&ss_e,"Failed to parse None.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&base_prim_path._prim_part);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional((optional<tinyusdz::Path> *)&value)
      ;
    }
    else if (c == '<') {
      value._prim_part._M_dataplus._M_p = (pointer)&value._prim_part.field_2;
      value._prim_part._M_string_length = 0;
      value._prim_part.field_2._M_local_buf[0] = '\0';
      value._prop_part._M_dataplus._M_p = (pointer)&value._prop_part.field_2;
      value._prop_part._M_string_length = 0;
      value._prop_part.field_2._M_local_buf[0] = '\0';
      value._variant_part._M_dataplus._M_p = (pointer)&value._variant_part.field_2;
      value._variant_part._M_string_length = 0;
      value._variant_part.field_2._M_local_buf[0] = '\0';
      value._variant_selection_part._M_dataplus._M_p =
           (pointer)&value._variant_selection_part.field_2;
      value._variant_selection_part._M_string_length = 0;
      value._variant_selection_part.field_2._M_local_buf[0] = '\0';
      value._variant_part_str._M_dataplus._M_p = (pointer)&value._variant_part_str.field_2;
      value._variant_part_str._M_string_length = 0;
      value._variant_part_str.field_2._M_local_buf[0] = '\0';
      value._element._M_dataplus._M_p = (pointer)&value._element.field_2;
      value._element._M_string_length = 0;
      value._element.field_2._M_local_buf[0] = '\0';
      value._path_type.has_value_ = false;
      value._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      value._valid = false;
      bVar1 = ReadBasicType(this,&value);
      if (bVar1) {
        GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
        ::std::__cxx11::string::string((string *)&abs_path,"",(allocator *)&err);
        Path::Path(&base_prim_path,(string *)&ss_e,&abs_path._prim_part);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        abs_path._prim_part._M_dataplus._M_p = (pointer)&abs_path._prim_part.field_2;
        abs_path._prim_part._M_string_length = 0;
        abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        abs_path._prop_part._M_dataplus._M_p = (pointer)&abs_path._prop_part.field_2;
        abs_path._prop_part._M_string_length = 0;
        abs_path._prop_part.field_2._M_local_buf[0] = '\0';
        abs_path._variant_part._M_dataplus._M_p = (pointer)&abs_path._variant_part.field_2;
        abs_path._variant_part._M_string_length = 0;
        abs_path._variant_part.field_2._M_local_buf[0] = '\0';
        abs_path._variant_selection_part._M_dataplus._M_p =
             (pointer)&abs_path._variant_selection_part.field_2;
        abs_path._variant_selection_part._M_string_length = 0;
        abs_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
        abs_path._variant_part_str._M_dataplus._M_p = (pointer)&abs_path._variant_part_str.field_2;
        abs_path._variant_part_str._M_string_length = 0;
        abs_path._variant_part_str.field_2._M_local_buf[0] = '\0';
        abs_path._element._M_dataplus._M_p = (pointer)&abs_path._element.field_2;
        abs_path._element._M_string_length = 0;
        abs_path._element.field_2._M_local_buf[0] = '\0';
        abs_path._path_type.has_value_ = false;
        abs_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        abs_path._valid = false;
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_local_buf[0] = '\0';
        bVar1 = pathutil::ResolveRelativePath(&base_prim_path,&value,&abs_path,&err);
        if (bVar1) {
          Relationship::set(result,&abs_path);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseRelationship");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdb6);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&values,"Invalid relative Path: {}. error = {}",&local_491);
          fmt::format<tinyusdz::Path,std::__cxx11::string>
                    (&local_298,(fmt *)&values,&value._prim_part,(Path *)&err,in_R8);
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_298);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_298);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        }
        ::std::__cxx11::string::_M_dispose();
        Path::~Path(&abs_path);
        Path::~Path(&base_prim_path);
        Path::~Path(&value);
        if (bVar1) goto LAB_002c3d3b;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseRelationship");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdab);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)&ss_e,"Failed to parse Path.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,&base_prim_path._prim_part);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        Path::~Path(&value);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseRelationship");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xde1);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::to_string(&abs_path._prim_part,(int)c);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &base_prim_path,"Unexpected char \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &abs_path);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &base_prim_path,"\" found. Expects Path or PathVector.");
      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&value);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,&value._prim_part);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseRelationship(Relationship *result) {
  char c;
  if (!LookChar1(&c)) {
    return false;
  }

  if (c == '<') {
    // Path
    Path value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse Path.");
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    Path base_prim_path(GetCurrentPrimPath(), "");
    Path abs_path;
    std::string err;
    if (!pathutil::ResolveRelativePath(base_prim_path, value, &abs_path,
                                       &err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Invalid relative Path: {}. error = {}", value, err));
    }

    result->set(abs_path);
  } else if (c == '[') {
    // PathVector
    std::vector<Path> values;
    if (!ParseBasicTypeArray(&values)) {
      PUSH_ERROR_AND_RETURN("Failed to parse PathVector.");
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    for (size_t i = 0; i < values.size(); i++) {
      Path base_prim_path(GetCurrentPrimPath(), "");
      Path abs_path;
      if (!pathutil::ResolveRelativePath(base_prim_path, values[i],
                                         &abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid relative Path: {}.",
                                          values[i].full_path_name()));
      }

      // replace
      values[i] = abs_path;
    }

    result->set(values);
  } else if (c == 'N') {
    // None
    nonstd::optional<Path> value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse None.");
    }

    // Should be empty for None.
    if (value.has_value()) {
      PUSH_ERROR_AND_RETURN("Failed to parse None.");
    }

    DCOUT("Relationship valueblock.");
    result->set_blocked();
  } else {
    PUSH_ERROR_AND_RETURN("Unexpected char \"" + std::to_string(c) +
                          "\" found. Expects Path or PathVector.");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  return true;
}